

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_until_node.hpp
# Opt level: O3

void __thiscall
ranger::bhvr_tree::
decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,handler_type *hdl)

{
  handler_type *this_00;
  function<void(bool,test_agent*)> local_70 [16];
  code *local_60;
  anon_class_56_4_3a710efc local_50;
  
  this_00 = &local_50.hdl;
  local_50.ap = ap;
  local_50.this = this;
  std::function<void_(bool,_test_agent_*)>::function(this_00,hdl);
  local_50.node = node;
  std::function<void(bool,test_agent*)>::
  function<ranger::bhvr_tree::decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
            (local_70,&local_50);
  (*node->_vptr_abstract_node[2])(node,ap,local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(local_70,local_70,3);
  }
  if (local_50.hdl.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.hdl.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 typename AgentProxy::handler_type hdl) const {
    node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
      if (result == m_expected) {
        ap(hdl, result);
      } else {
        exec_impl(ap, node, std::move(hdl));
      }
    });
  }